

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  uint nstout;
  int iVar3;
  uint nsteps;
  double slipspring_rate;
  string filename;
  string local_128;
  NetwMin netw_min;
  cb3D_integrator b3D_integrator;
  
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0xc;
  poVar1 = std::operator<<((ostream *)&std::cout,"#: Use of the code: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#: ./netmin.x [data_file] [slip-spring creation rate] [nsteps] [nevery_steps]\n"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  iVar3 = 1;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"#: Data file has not been specified from command line.\n"
                   );
    std::__cxx11::string::assign((char *)&filename);
    poVar1 = std::operator<<((ostream *)&std::cout,"#: --- \'");
    poVar1 = std::operator<<(poVar1,(string *)&filename);
    std::operator<<(poVar1,"\' will be used as data file.\n");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&b3D_integrator,argv[1],(allocator<char> *)&netw_min);
    std::__cxx11::string::operator=((string *)&filename,(string *)&b3D_integrator);
    std::__cxx11::string::~string((string *)&b3D_integrator);
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&b3D_integrator,argv[2],(allocator<char> *)&netw_min);
      slipspring_rate = StringToNumber<double>((string *)&b3D_integrator);
      std::__cxx11::string::~string((string *)&b3D_integrator);
      nstout = 1000;
      nsteps = 2000000000;
      if (argc != 3) {
        lVar2 = atol(argv[3]);
        nsteps = (uint)lVar2;
        if (4 < (uint)argc) {
          lVar2 = atol(argv[4]);
          nstout = (uint)lVar2;
        }
      }
      std::__cxx11::string::string((string *)&local_128,(string *)&filename);
      NetworkNS::NetwMin::NetwMin(&netw_min,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      NetworkNS::cb3D_integrator::cb3D_integrator(&b3D_integrator,&netw_min,500.0,slipspring_rate);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "#: Integrator has been initialized. Simulation will start for ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," steps.\n");
      std::operator<<((ostream *)&std::cout,"#: The rate for the slip-spring creation is: ");
      poVar1 = std::ostream::_M_insert<double>(slipspring_rate);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"#: The timestep of the integrator will be: ");
      poVar1 = std::ostream::_M_insert<double>(1.0);
      std::operator<<(poVar1," ps.\n");
      poVar1 = std::operator<<((ostream *)&std::cout,"#: Report will be written every: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," steps.\n");
      NetworkNS::cb3D_integrator::integrate(&b3D_integrator,nsteps,1.0,nstout);
      (**(netw_min.my_traj_file)->_vptr_dump)();
      NetworkNS::cb3D_integrator::~cb3D_integrator(&b3D_integrator);
      iVar3 = 0;
    }
  }
  std::__cxx11::string::~string((string *)&filename);
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {

    
   unsigned int bd3D_nsteps = 0, bd3D_write_every = 0;
   
   cout.precision(12);
   
   cout << "#: Use of the code: "<< endl;
   cout << "#: ./netmin.x [data_file] [slip-spring creation rate] [nsteps] [nevery_steps]\n" << endl;
   
   std::string filename;
   if (argc > 1)
      filename = std::string(argv[1]);
   else{
      cout << "#: Data file has not been specified from command line.\n";
      filename = "emsipon.data";
      cout << "#: --- '" << filename << "' will be used as data file.\n";
   }
   
   double creation_rate;
   if (argc > 2)
      creation_rate = StringToNumber<double>(argv[2]);
   else
      return(1);
   
   if (argc > 3)
      bd3D_nsteps = atol(argv[3]);
   else
      bd3D_nsteps = 2000000000;
   
   if (argc > 4)
      bd3D_write_every = atol(argv[4]);
   else
      bd3D_write_every = 1000;
      

#ifdef FENE_SLS  
   cout << "#: (warning): FENE potential will be used for slip-springs.\n";
#endif
   
   // Define a new pointer to the class:
   NetwMin netw_min(filename);
   cb3D_integrator b3D_integrator(&netw_min, 500.0, creation_rate);
   
   cout << "#: Integrator has been initialized. Simulation will start for "<<bd3D_nsteps<< " steps.\n";
   cout << "#: The rate for the slip-spring creation is: " << creation_rate << endl;
   
   // Simulation starts here:
   double timestep = 1.0; // integration timestep in ps.
   cout << "#: The timestep of the integrator will be: " << timestep << " ps.\n";
   cout << "#: Report will be written every: " << bd3D_write_every << " steps.\n";
   
   
   b3D_integrator.integrate(bd3D_nsteps, timestep, bd3D_write_every);
     
   // Close trajectory file:
   netw_min.my_traj_file->~dump();
   
   
   return (EXIT_SUCCESS);
}